

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::SelectNth
          (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          SubFrames *frames,idx_t n)

{
  pointer puVar1;
  size_type sVar2;
  value_type vVar3;
  pointer pFVar4;
  pointer pFVar5;
  ulong *puVar6;
  ulong uVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  vector<unsigned_long,_true> *this_00;
  const_reference pvVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong *puVar15;
  size_type sVar16;
  pointer puVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  pointer pFVar22;
  ulong uVar23;
  long lVar24;
  idx_t iVar25;
  unsigned_long uVar26;
  size_type __n;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  pair<unsigned_long,_unsigned_long> pVar30;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> cascades;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> matches;
  ulong local_e8;
  ulong local_e0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar19 = ((long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar19 < 2) {
    uVar26 = 0;
    uVar7 = 0;
  }
  else {
    local_e0 = 1;
    __n = uVar19 - 2;
    for (uVar7 = __n; uVar7 != 0; uVar7 = uVar7 - 1) {
      local_e0 = local_e0 << 5;
    }
    if (__n < 3) {
      local_e8 = 0;
    }
    else {
      local_78 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      pvVar8 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::operator[](&this->tree,uVar19 - 1);
      if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sVar16 = 0;
        do {
          pvVar9 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar16);
          puVar15 = (pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar19 = (long)(pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                         .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar15 >> 3;
          puVar21 = puVar15;
          if ((long)uVar19 < 1) {
            *(ulong *)(local_98 + sVar16 * 0x10) = 0;
          }
          else {
            puVar12 = puVar15;
            uVar7 = uVar19;
            do {
              uVar23 = uVar7 >> 1;
              uVar7 = ~uVar23 + uVar7;
              puVar14 = puVar12 + uVar23 + 1;
              if (pvVar9->start <= puVar12[uVar23]) {
                uVar7 = uVar23;
                puVar14 = puVar12;
              }
              puVar12 = puVar14;
            } while (0 < (long)uVar7);
            *(ulong *)(local_98 + sVar16 * 0x10) =
                 (long)puVar12 - (long)puVar15 >> 3 & 0xffffffffffffffe0;
            if (0 < (long)uVar19) {
              do {
                uVar7 = uVar19 >> 1;
                uVar19 = ~uVar7 + uVar19;
                puVar12 = puVar21 + uVar7 + 1;
                if (pvVar9->end <= puVar21[uVar7]) {
                  uVar19 = uVar7;
                  puVar12 = puVar21;
                }
                puVar21 = puVar12;
              } while (0 < (long)uVar19);
            }
          }
          *(ulong *)(local_98 + sVar16 * 0x10 + 8) =
               (long)puVar21 - (long)puVar15 >> 3 & 0xffffffffffffffe0;
          sVar16 = sVar16 + 1;
        } while (sVar16 < (ulong)((long)(frames->
                                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ).
                                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(frames->
                                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ).
                                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      local_e8 = 0;
      uVar19 = __n;
      do {
        pvVar8 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this->tree,uVar19 + 1);
        this_00 = &pvVar8->second;
        pvVar8 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this->tree,uVar19);
        puVar1 = (pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar25 = n;
        do {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar7 = 0;
            uVar23 = 0;
          }
          else {
            uVar23 = 0;
            sVar16 = 0;
            do {
              pvVar9 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar16);
              lVar24 = sVar16 * 0x10;
              sVar2 = *(size_type *)(local_98 + lVar24);
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2);
              vVar3 = *pvVar10;
              puVar17 = puVar1 + vVar3;
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2 + 0x20);
              uVar7 = *pvVar10 - vVar3;
              if (uVar7 != 0 && (long)vVar3 <= (long)*pvVar10) {
                do {
                  uVar13 = uVar7 >> 1;
                  uVar20 = ~uVar13 + uVar7;
                  uVar7 = uVar13;
                  if ((puVar17 + uVar13 + 1)[0xffffffffffffffff] < pvVar9->start) {
                    puVar17 = puVar17 + uVar13 + 1;
                    uVar7 = uVar20;
                  }
                } while (0 < (long)uVar7);
              }
              lVar18 = (long)puVar17 - (long)puVar1 >> 3;
              *(long *)(local_68 + lVar24) = lVar18;
              sVar2 = *(size_type *)(local_98 + lVar24 + 8);
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2);
              vVar3 = *pvVar10;
              puVar15 = puVar1 + vVar3;
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2 + 0x20);
              uVar7 = *pvVar10 - vVar3;
              if (uVar7 != 0 && (long)vVar3 <= (long)*pvVar10) {
                do {
                  uVar13 = uVar7 >> 1;
                  uVar20 = ~uVar13 + uVar7;
                  uVar7 = uVar13;
                  if (puVar15[uVar13] < pvVar9->end) {
                    puVar15 = puVar15 + uVar13 + 1;
                    uVar7 = uVar20;
                  }
                } while (0 < (long)uVar7);
              }
              lVar27 = (long)puVar15 - (long)puVar1 >> 3;
              *(long *)(local_68 + lVar24 + 8) = lVar27;
              uVar23 = (uVar23 - lVar18) + lVar27;
              sVar16 = sVar16 + 1;
              uVar7 = (long)(frames->
                            super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                            .
                            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(frames->
                            super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                            .
                            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4;
            } while (sVar16 < uVar7);
          }
          if (iVar25 < uVar23) {
            n = iVar25;
            if (uVar7 != 0) {
              auVar29._8_4_ = (int)local_e8;
              auVar29._0_8_ = local_e8;
              auVar29._12_4_ = (int)(local_e8 >> 0x20);
              lVar24 = 0;
              do {
                uVar13 = *(ulong *)(local_68 + lVar24 + 8);
                *(ulong *)(local_98 + lVar24) =
                     (*(ulong *)(local_68 + lVar24) & 0xffffffffffffffe0) + local_e8 * 0x40;
                *(ulong *)(local_98 + lVar24 + 8) =
                     (uVar13 & 0xffffffffffffffe0) + auVar29._8_8_ * 0x40;
                lVar24 = lVar24 + 0x10;
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
            }
          }
          else {
            if (uVar7 != 0) {
              plVar11 = (long *)local_98;
              do {
                *plVar11 = *plVar11 + 1;
                plVar11[1] = plVar11[1] + 1;
                plVar11 = plVar11 + 2;
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
            }
            local_e8 = local_e8 + 1;
            n = iVar25 - uVar23;
          }
          bVar28 = uVar23 <= iVar25;
          iVar25 = n;
        } while (bVar28);
        local_e8 = local_e8 << 5;
        local_e0 = local_e0 >> 5;
        __n = uVar19 - 1;
        bVar28 = 2 < uVar19;
        uVar19 = __n;
      } while (bVar28);
    }
    for (; __n != 0; __n = __n - 1) {
      pvVar8 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::operator[](&this->tree,__n);
      puVar15 = (pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + local_e0 * local_e8;
      while (puVar21 = puVar15 + local_e0,
            puVar21 < (pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
        if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar19 = 0;
        }
        else {
          uVar7 = (long)puVar21 - (long)puVar15 >> 3;
          uVar19 = 0;
          sVar16 = 0;
          do {
            pvVar9 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar16);
            puVar12 = puVar15;
            if (0 < (long)uVar7) {
              uVar23 = uVar7;
              do {
                uVar13 = uVar23 >> 1;
                uVar23 = ~uVar13 + uVar23;
                puVar14 = puVar12 + uVar13 + 1;
                if (pvVar9->start <= puVar12[uVar13]) {
                  uVar23 = uVar13;
                  puVar14 = puVar12;
                }
                puVar12 = puVar14;
              } while (0 < (long)uVar23);
            }
            uVar23 = (long)puVar21 - (long)puVar12 >> 3;
            puVar14 = puVar12;
            if (0 < (long)uVar23) {
              do {
                uVar13 = uVar23 >> 1;
                uVar23 = ~uVar13 + uVar23;
                puVar6 = puVar14 + uVar13 + 1;
                if (pvVar9->end <= puVar14[uVar13]) {
                  uVar23 = uVar13;
                  puVar6 = puVar14;
                }
                puVar14 = puVar6;
              } while (0 < (long)uVar23);
            }
            uVar19 = uVar19 + ((long)puVar14 - (long)puVar12 >> 3);
            sVar16 = sVar16 + 1;
          } while (sVar16 < (ulong)((long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        if (n < uVar19) break;
        local_e8 = local_e8 + 1;
        puVar15 = puVar21;
        n = n - uVar19;
      }
      local_e8 = local_e8 << 5;
      local_e0 = local_e0 >> 5;
    }
    pvVar8 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this->tree,0);
    puVar1 = (pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar26 = n + 1;
    pvVar8 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this->tree,0);
    uVar19 = (long)(pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar8->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (local_e8 + 0x20 < uVar19) {
      uVar19 = local_e8 + 0x20;
    }
    uVar7 = local_e8;
    if (local_e8 < uVar19) {
      pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
               super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl
               .super__Vector_impl_data._M_start;
      pFVar5 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
               super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl
               .super__Vector_impl_data._M_finish;
      do {
        if (pFVar4 != pFVar5) {
          uVar7 = puVar1[local_e8];
          pFVar22 = pFVar4;
          do {
            uVar26 = uVar26 - (uVar7 < pFVar22->end && pFVar22->start <= uVar7);
            pFVar22 = pFVar22 + 1;
          } while (pFVar22 != pFVar5);
        }
        uVar7 = local_e8;
      } while ((uVar26 != 0) && (local_e8 = local_e8 + 1, uVar7 = uVar19, local_e8 != uVar19));
    }
  }
  pVar30.second = uVar26;
  pVar30.first = uVar7;
  return pVar30;
}

Assistant:

pair<idx_t, idx_t> MergeSortTree<E, O, CMP, F, C>::SelectNth(const SubFrames &frames, idx_t n) const {
	// Handle special case of a one-element tree
	if (tree.size() < 2) {
		return {0, 0};
	}

	// 	The first level contains a single run,
	//	so the only thing we need is any cascading pointers
	auto level_no = tree.size() - 2;
	idx_t level_width = 1;
	for (idx_t i = 0; i < level_no; ++i) {
		level_width *= FANOUT;
	}

	// Find Nth element in a top-down traversal
	idx_t result = 0;

	// First, handle levels with cascading pointers
	const auto min_cascaded = LowestCascadingLevel();
	if (level_no > min_cascaded) {
		//	Initialise the cascade indicies from the previous level
		using CascadeRange = pair<idx_t, idx_t>;
		std::array<CascadeRange, 3> cascades;
		const auto &level = tree[level_no + 1].first;
		for (idx_t f = 0; f < frames.size(); ++f) {
			const auto &frame = frames[f];
			auto &cascade_idx = cascades[f];
			const auto lower_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.start) - level.begin());
			cascade_idx.first = lower_idx / CASCADING * FANOUT;
			const auto upper_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.end) - level.begin());
			cascade_idx.second = upper_idx / CASCADING * FANOUT;
		}

		// 	Walk the cascaded levels
		for (; level_no >= min_cascaded; --level_no) {
			//	The cascade indicies into this level are in the previous level
			const auto &level_cascades = tree[level_no + 1].second;

			// Go over all children until we found enough in range
			const auto *level_data = tree[level_no].first.data();
			while (true) {
				idx_t matched = 0;
				std::array<CascadeRange, 3> matches;
				for (idx_t f = 0; f < frames.size(); ++f) {
					const auto &frame = frames[f];
					auto &cascade_idx = cascades[f];
					auto &match = matches[f];

					const auto lower_begin = level_data + level_cascades[cascade_idx.first];
					const auto lower_end = level_data + level_cascades[cascade_idx.first + FANOUT];
					match.first =
					    UnsafeNumericCast<idx_t>(std::lower_bound(lower_begin, lower_end, frame.start) - level_data);

					const auto upper_begin = level_data + level_cascades[cascade_idx.second];
					const auto upper_end = level_data + level_cascades[cascade_idx.second + FANOUT];
					match.second =
					    UnsafeNumericCast<idx_t>(std::lower_bound(upper_begin, upper_end, frame.end) - level_data);

					matched += idx_t(match.second - match.first);
				}
				if (matched > n) {
					// 	Too much in this level, so move down to leftmost child candidate within the cascade range
					for (idx_t f = 0; f < frames.size(); ++f) {
						auto &cascade_idx = cascades[f];
						auto &match = matches[f];
						cascade_idx.first = (match.first / CASCADING + 2 * result) * FANOUT;
						cascade_idx.second = (match.second / CASCADING + 2 * result) * FANOUT;
					}
					break;
				}

				//	Not enough in this child, so move right
				for (idx_t f = 0; f < frames.size(); ++f) {
					auto &cascade_idx = cascades[f];
					++cascade_idx.first;
					++cascade_idx.second;
				}
				++result;
				n -= matched;
			}
			result *= FANOUT;
			level_width /= FANOUT;
		}
	}

	//	Continue with the uncascaded levels (except the first)
	for (; level_no > 0; --level_no) {
		const auto &level = tree[level_no].first;
		auto range_begin = level.begin() + UnsafeNumericCast<int64_t>(result * level_width);
		auto range_end = range_begin + UnsafeNumericCast<int64_t>(level_width);
		while (range_end < level.end()) {
			idx_t matched = 0;
			for (idx_t f = 0; f < frames.size(); ++f) {
				const auto &frame = frames[f];
				const auto lower_match = std::lower_bound(range_begin, range_end, frame.start);
				const auto upper_match = std::lower_bound(lower_match, range_end, frame.end);
				matched += idx_t(upper_match - lower_match);
			}
			if (matched > n) {
				// 	Too much in this level, so move down to leftmost child candidate
				//	Since we have no cascade pointers left, this is just the start of the next level.
				break;
			}
			//	Not enough in this child, so move right
			range_begin = range_end;
			range_end += UnsafeNumericCast<int64_t>(level_width);
			++result;
			n -= matched;
		}
		result *= FANOUT;
		level_width /= FANOUT;
	}

	// The last level
	const auto *level_data = tree[level_no].first.data();
	++n;

	const auto count = tree[level_no].first.size();
	for (const auto limit = MinValue<idx_t>(result + FANOUT, count); result < limit; ++result) {
		const auto v = level_data[result];
		for (const auto &frame : frames) {
			n -= (v >= frame.start) && (v < frame.end);
		}
		if (!n) {
			break;
		}
	}

	return {result, n};
}